

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O2

void __thiscall CompileCommandParser::ParseTranslationUnits(CompileCommandParser *this)

{
  bool bVar1;
  allocator local_49;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  local_48.field_2._M_allocated_capacity = 0;
  std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ::_M_move_assign(&this->TranslationUnits,&local_48);
  std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ::~vector((vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
             *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"at start of compile command file\n",&local_49);
  ExpectOrDie(this,'[',&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  do {
    ParseTranslationUnit(this);
    std::
    vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>::
    push_back(&this->TranslationUnits,&this->Command);
    bVar1 = Expect(this,',');
  } while (bVar1);
  std::__cxx11::string::string((string *)&local_48,"at end of array",&local_49);
  ExpectOrDie(this,']',&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void ParseTranslationUnits()
  {
    this->TranslationUnits = TranslationUnitsType();
    ExpectOrDie('[', "at start of compile command file\n");
    do
      {
      ParseTranslationUnit();
      this->TranslationUnits.push_back(this->Command);
      } while(Expect(','));
    ExpectOrDie(']', "at end of array");
  }